

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O0

int * Gia_ManFraigSelectReprs(Gia_Man_t *p,Gia_Man_t *pClp,int fVerbose,int *pFlopTypes)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int Lit;
  int iVar11;
  int iVar12;
  int *__s;
  undefined4 *__s_00;
  Gia_Obj_t *pGVar13;
  Vec_Int_t *pVVar14;
  Vec_Int_t *pVVar15;
  ulong uVar16;
  bool bVar17;
  Gia_Obj_t *pRepr;
  uint local_68;
  int nReprs;
  int nConsts;
  int fCompl;
  int iReprClp;
  int iLitClp2;
  int iLitClp;
  int i;
  int *pClp2Gia;
  int *pReprs;
  Tim_Man_t *pManTime;
  Vec_Int_t *vCarryOuts;
  Gia_Obj_t *pObj;
  int *pFlopTypes_local;
  int fVerbose_local;
  Gia_Man_t *pClp_local;
  Gia_Man_t *p_local;
  
  pvVar1 = p->pManTime;
  iVar6 = Gia_ManObjNum(p);
  __s = (int *)malloc((long)iVar6 << 2);
  iVar6 = Gia_ManObjNum(p);
  memset(__s,0xff,(long)iVar6 << 2);
  iVar6 = Gia_ManObjNum(pClp);
  __s_00 = (undefined4 *)malloc((long)iVar6 << 2);
  iVar6 = Gia_ManObjNum(pClp);
  memset(__s_00,0xff,(long)iVar6 << 2);
  local_68 = 0;
  pRepr._4_4_ = 0;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("pManTime != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x1d0,"int *Gia_ManFraigSelectReprs(Gia_Man_t *, Gia_Man_t *, int, int *)");
  }
  iLitClp2 = 1;
  while( true ) {
    bVar17 = false;
    if (iLitClp2 < pClp->nObjs) {
      vCarryOuts = (Vec_Int_t *)Gia_ManObj(pClp,iLitClp2);
      bVar17 = vCarryOuts != (Vec_Int_t *)0x0;
    }
    if (!bVar17) break;
    iVar6 = Gia_ObjIsCo((Gia_Obj_t *)vCarryOuts);
    if ((iVar6 == 0) && (iVar6 = Gia_ObjReprSelf(pClp,iLitClp2), iLitClp2 != iVar6)) {
      iVar6 = Gia_ObjReprSelf(pClp,iLitClp2);
      if (iVar6 == 0) {
        local_68 = local_68 + 1;
      }
      else {
        pRepr._4_4_ = pRepr._4_4_ + 1;
      }
    }
    iLitClp2 = iLitClp2 + 1;
  }
  if (fVerbose != 0) {
    printf("Computed %d const objects and %d other objects.\n",(ulong)local_68,(ulong)pRepr._4_4_);
  }
  pRepr._4_4_ = 0;
  local_68 = 0;
  Gia_ManCleanMark0(p);
  iVar6 = Gia_ManPoNum(p);
  iVar7 = Gia_ManRegBoxNum(p);
  for (iLitClp2 = iVar6 - iVar7; iVar6 = Gia_ManPoNum(p), iLitClp2 < iVar6; iLitClp2 = iLitClp2 + 1)
  {
    pGVar13 = Gia_ManPo(p,iLitClp2);
    vCarryOuts = (Vec_Int_t *)Gia_ObjFanin0(pGVar13);
    iVar6 = Gia_ObjIsCi((Gia_Obj_t *)vCarryOuts);
    if (iVar6 == 0) {
      __assert_fail("Gia_ObjIsCi(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                    ,0x1e6,"int *Gia_ManFraigSelectReprs(Gia_Man_t *, Gia_Man_t *, int, int *)");
    }
    uVar2._0_4_ = vCarryOuts->nCap;
    uVar2._4_4_ = vCarryOuts->nSize;
    uVar16 = uVar2 & 0xffffffffbfffffff | 0x40000000;
    vCarryOuts->nCap = (int)uVar16;
    vCarryOuts->nSize = (int)(uVar16 >> 0x20);
  }
  pVVar14 = Gia_ManComputeCarryOuts(p);
  iLitClp2 = 0;
  while( true ) {
    iVar6 = Vec_IntSize(pVVar14);
    bVar17 = false;
    if (iLitClp2 < iVar6) {
      iVar6 = Vec_IntEntry(pVVar14,iLitClp2);
      vCarryOuts = (Vec_Int_t *)Gia_ManObj(p,iVar6);
      bVar17 = vCarryOuts != (Vec_Int_t *)0x0;
    }
    if (!bVar17) break;
    uVar3._0_4_ = vCarryOuts->nCap;
    uVar3._4_4_ = vCarryOuts->nSize;
    uVar16 = uVar3 & 0xffffffffbfffffff | 0x40000000;
    vCarryOuts->nCap = (int)uVar16;
    vCarryOuts->nSize = (int)(uVar16 >> 0x20);
    iLitClp2 = iLitClp2 + 1;
  }
  if (fVerbose != 0) {
    uVar8 = Gia_ManRegBoxNum(p);
    uVar9 = Vec_IntSize(pVVar14);
    uVar10 = Gia_ManNonRegBoxNum(p);
    printf("Fixed %d flop inputs and %d box/box connections (out of %d non-flop boxes).\n",
           (ulong)uVar8,(ulong)uVar9,(ulong)uVar10);
  }
  Vec_IntFree(pVVar14);
  pFlopTypes[2] = 0;
  pFlopTypes[1] = 0;
  *pFlopTypes = 0;
  iLitClp2 = 0;
  while( true ) {
    iVar6 = Gia_ManRegNum(pClp);
    bVar17 = false;
    if (iLitClp2 < iVar6) {
      iVar6 = Gia_ManPiNum(pClp);
      vCarryOuts = (Vec_Int_t *)Gia_ManCi(pClp,iVar6 + iLitClp2);
      bVar17 = vCarryOuts != (Vec_Int_t *)0x0;
    }
    if (!bVar17) break;
    pVVar14 = (Vec_Int_t *)Gia_ObjReprObj(pClp,iLitClp2);
    if ((pVVar14 != (Vec_Int_t *)0x0) && (pVVar14 != vCarryOuts)) {
      pVVar15 = (Vec_Int_t *)Gia_ManConst0(pClp);
      if (pVVar14 == pVVar15) {
        *pFlopTypes = *pFlopTypes + 1;
      }
      else {
        iVar6 = Gia_ObjIsRo(pClp,(Gia_Obj_t *)pVVar14);
        if (iVar6 != 0) {
          pFlopTypes[1] = pFlopTypes[1] + 1;
        }
      }
    }
    iLitClp2 = iLitClp2 + 1;
  }
  *__s_00 = 0;
  Gia_ManSetPhase(pClp);
  iLitClp2 = 1;
  do {
    bVar17 = false;
    if (iLitClp2 < p->nObjs) {
      vCarryOuts = (Vec_Int_t *)Gia_ManObj(p,iLitClp2);
      bVar17 = vCarryOuts != (Vec_Int_t *)0x0;
    }
    if (!bVar17) {
      if (__s_00 != (undefined4 *)0x0) {
        free(__s_00);
      }
      iLitClp2 = 0;
      while( true ) {
        iVar6 = Vec_IntSize(p->vCis);
        bVar17 = false;
        if (iLitClp2 < iVar6) {
          vCarryOuts = (Vec_Int_t *)Gia_ManCi(p,iLitClp2);
          bVar17 = vCarryOuts != (Vec_Int_t *)0x0;
        }
        if (!bVar17) break;
        uVar16._0_4_ = vCarryOuts->nCap;
        uVar16._4_4_ = vCarryOuts->nSize;
        vCarryOuts->nCap = (int)(uVar16 & 0xffffffffbfffffff);
        vCarryOuts->nSize = (int)((uVar16 & 0xffffffffbfffffff) >> 0x20);
        iLitClp2 = iLitClp2 + 1;
      }
      if (fVerbose != 0) {
        printf("Found %d const objects and %d other objects.\n",(ulong)local_68,(ulong)pRepr._4_4_);
      }
      return __s;
    }
    iVar6 = Gia_ObjIsCo((Gia_Obj_t *)vCarryOuts);
    if ((iVar6 == 0) &&
       ((iVar6 = Gia_ObjIsCi((Gia_Obj_t *)vCarryOuts), iVar6 == 0 ||
        (uVar4._0_4_ = vCarryOuts->nCap, uVar4._4_4_ = vCarryOuts->nSize, (uVar4 >> 0x1e & 1) == 0))
       )) {
      iVar6 = Gia_ObjIsCi((Gia_Obj_t *)vCarryOuts);
      if ((iVar6 == 0) && (iVar6 = Gia_ObjIsAnd((Gia_Obj_t *)vCarryOuts), iVar6 == 0)) {
        __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                      ,0x209,"int *Gia_ManFraigSelectReprs(Gia_Man_t *, Gia_Man_t *, int, int *)");
      }
      iVar6 = Gia_ObjValue((Gia_Obj_t *)vCarryOuts);
      if (iVar6 != -1) {
        iVar7 = Abc_Lit2Var(iVar6);
        iVar7 = Gia_ObjReprSelf(pClp,iVar7);
        if (__s_00[iVar7] == -1) {
          __s_00[iVar7] = iLitClp2;
        }
        else {
          pGVar13 = Gia_ManObj(p,__s_00[iVar7]);
          Lit = Gia_ObjValue(pGVar13);
          iVar11 = Abc_Lit2Var(iVar6);
          iVar11 = Gia_ObjReprSelf(pClp,iVar11);
          iVar12 = Abc_Lit2Var(Lit);
          iVar12 = Gia_ObjReprSelf(pClp,iVar12);
          if (iVar11 != iVar12) {
            __assert_fail("Gia_ObjReprSelf(pClp, Abc_Lit2Var(iLitClp)) == Gia_ObjReprSelf(pClp, Abc_Lit2Var(iLitClp2))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                          ,0x213,
                          "int *Gia_ManFraigSelectReprs(Gia_Man_t *, Gia_Man_t *, int, int *)");
          }
          uVar8 = Abc_LitIsCompl(iVar6);
          uVar9 = Abc_LitIsCompl(Lit);
          iVar6 = Abc_Lit2Var(iVar6);
          pGVar13 = Gia_ManObj(pClp,iVar6);
          uVar5 = *(undefined8 *)pGVar13;
          iVar6 = Abc_Lit2Var(Lit);
          pGVar13 = Gia_ManObj(pClp,iVar6);
          iVar6 = Abc_Var2Lit(__s_00[iVar7],
                              (uint)((ulong)*(undefined8 *)pGVar13 >> 0x3f) ^
                              (uint)((ulong)uVar5 >> 0x3f) ^ uVar8 ^ uVar9);
          __s[iLitClp2] = iVar6;
          iVar6 = Abc_Lit2Var(__s[iLitClp2]);
          if (iLitClp2 <= iVar6) {
            __assert_fail("Abc_Lit2Var(pReprs[i]) < i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                          ,0x218,
                          "int *Gia_ManFraigSelectReprs(Gia_Man_t *, Gia_Man_t *, int, int *)");
          }
          if (__s_00[iVar7] == 0) {
            local_68 = local_68 + 1;
          }
          else {
            pRepr._4_4_ = pRepr._4_4_ + 1;
          }
        }
      }
    }
    iLitClp2 = iLitClp2 + 1;
  } while( true );
}

Assistant:

int * Gia_ManFraigSelectReprs( Gia_Man_t * p, Gia_Man_t * pClp, int fVerbose, int pFlopTypes[3] )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vCarryOuts;
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    int * pReprs   = ABC_FALLOC( int, Gia_ManObjNum(p) );
    int * pClp2Gia = ABC_FALLOC( int, Gia_ManObjNum(pClp) );
    int i, iLitClp, iLitClp2, iReprClp, fCompl;
    int nConsts = 0, nReprs = 0;
    assert( pManTime != NULL );
    // count the number of equivalent objects
    Gia_ManForEachObj1( pClp, pObj, i )
    {
        if ( Gia_ObjIsCo(pObj) )
            continue;
        if ( i == Gia_ObjReprSelf(pClp, i) )
            continue;
        if ( Gia_ObjReprSelf(pClp, i) == 0 )
            nConsts++;
        else
            nReprs++;
    }
    if ( fVerbose )
        printf( "Computed %d const objects and %d other objects.\n", nConsts, nReprs );
    nConsts = nReprs = 0;

    // mark flop input boxes
    Gia_ManCleanMark0( p );
    for ( i = Gia_ManPoNum(p) - Gia_ManRegBoxNum(p); i < Gia_ManPoNum(p); i++ )
    {
        pObj = Gia_ObjFanin0( Gia_ManPo(p, i) );
        assert( Gia_ObjIsCi(pObj) );
        pObj->fMark0 = 1;
    }
    // mark connects between last box inputs and first box outputs
    vCarryOuts = Gia_ManComputeCarryOuts( p );
    Gia_ManForEachObjVec( vCarryOuts, p, pObj, i )
        pObj->fMark0 = 1;
    if ( fVerbose )
        printf( "Fixed %d flop inputs and %d box/box connections (out of %d non-flop boxes).\n", 
            Gia_ManRegBoxNum(p), Vec_IntSize(vCarryOuts), Gia_ManNonRegBoxNum(p) );
    Vec_IntFree( vCarryOuts );

    // collect equivalent node info
    pFlopTypes[0] = pFlopTypes[1] = pFlopTypes[2] = 0;
    Gia_ManForEachRo( pClp, pObj, i )
    {
        Gia_Obj_t * pRepr = Gia_ObjReprObj(pClp, i);
        if ( pRepr && pRepr != pObj )
        {
            if ( pRepr == Gia_ManConst0(pClp) )
                pFlopTypes[0]++;
            else if ( Gia_ObjIsRo(pClp, pRepr) )
                pFlopTypes[1]++;
        }
    }

    // compute representatives
    pClp2Gia[0] = 0;
    Gia_ManSetPhase( pClp );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCo(pObj) )
            continue;
        if ( Gia_ObjIsCi(pObj) && pObj->fMark0 ) // skip CI pointed by CO
            continue;
        assert( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) );
        iLitClp = Gia_ObjValue(pObj);
        if ( iLitClp == -1 )
            continue;
        iReprClp = Gia_ObjReprSelf( pClp, Abc_Lit2Var(iLitClp) );
        if ( pClp2Gia[iReprClp] == -1 )
            pClp2Gia[iReprClp] = i;
        else
        { 
            iLitClp2 = Gia_ObjValue( Gia_ManObj(p, pClp2Gia[iReprClp]) );
            assert( Gia_ObjReprSelf(pClp, Abc_Lit2Var(iLitClp)) == Gia_ObjReprSelf(pClp, Abc_Lit2Var(iLitClp2)) );
            fCompl  = Abc_LitIsCompl(iLitClp) ^ Abc_LitIsCompl(iLitClp2);
            fCompl ^= Gia_ManObj(pClp, Abc_Lit2Var(iLitClp))->fPhase;
            fCompl ^= Gia_ManObj(pClp, Abc_Lit2Var(iLitClp2))->fPhase;
            pReprs[i] = Abc_Var2Lit( pClp2Gia[iReprClp], fCompl );
            assert( Abc_Lit2Var(pReprs[i]) < i );
            if ( pClp2Gia[iReprClp] == 0 )
                nConsts++;
            else
                nReprs++;
        }
    }
    ABC_FREE( pClp2Gia );
    Gia_ManForEachCi( p, pObj, i )
        pObj->fMark0 = 0;
    if ( fVerbose )
        printf( "Found %d const objects and %d other objects.\n", nConsts, nReprs );
    return pReprs;
}